

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer.cc
# Opt level: O3

bool __thiscall
google::protobuf::util::MessageDifferencer::MatchRepeatedFieldIndices
          (MessageDifferencer *this,Message *message1,Message *message2,int unpacked_any,
          FieldDescriptor *repeated_field,MapKeyComparator *key_comparator,
          vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
          *parent_fields,vector<int,_std::allocator<int>_> *match_list1,
          vector<int,_std::allocator<int>_> *match_list2)

{
  pointer piVar1;
  MessageDifferencer *pMVar2;
  bool bVar3;
  byte bVar4;
  uint uVar5;
  uint uVar6;
  ulong extraout_RDX;
  ulong extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong uVar7;
  int iVar8;
  size_type __n;
  ulong uVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  Reporter *pRVar14;
  int index1;
  bool bVar15;
  Metadata MVar16;
  bool local_159;
  uint local_158;
  int unpacked_any_local;
  Reporter *local_150;
  FieldDescriptor *repeated_field_local;
  allocator_type local_139;
  size_type local_138;
  MapKeyComparator *local_130;
  MessageDifferencer *local_128;
  Message *local_120;
  Message *local_118;
  MapKeyComparator *key_comparator_local;
  vector<int,_std::allocator<int>_> num_diffs_list1;
  NumDiffsReporter num_diffs_reporter;
  MaximumMatcher local_d8;
  vector<bool,_std::allocator<bool>_> local_80;
  _func_void *local_58;
  undefined8 uStack_50;
  code *local_48;
  undefined8 uStack_40;
  
  unpacked_any_local = unpacked_any;
  repeated_field_local = repeated_field;
  local_130 = key_comparator;
  local_128 = this;
  key_comparator_local = key_comparator;
  MVar16 = Message::GetMetadata(message1);
  local_120 = message1;
  uVar5 = Reflection::FieldSize(MVar16.reflection,message1,repeated_field);
  MVar16 = Message::GetMetadata(message2);
  local_118 = message2;
  uVar6 = Reflection::FieldSize(MVar16.reflection,message2,repeated_field);
  bVar3 = IsTreatedAsSmartSet(this,repeated_field);
  __n = (size_type)(int)uVar5;
  local_d8.count1_ = -1;
  local_158 = uVar5;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign(match_list1,__n,&local_d8.count1_);
  pMVar2 = local_128;
  local_138 = (size_type)(int)uVar6;
  local_d8.count1_ = 0xffffffff;
  std::vector<int,_std::allocator<int>_>::_M_fill_assign(match_list2,local_138,&local_d8.count1_);
  pRVar14 = pMVar2->reporter_;
  if ((uVar6 == 1 && uVar5 == 1) &&
     (local_130 = (MapKeyComparator *)((ulong)local_130 | (ulong)pRVar14),
     local_130 == (MapKeyComparator *)0x0)) {
    piVar1 = (match_list1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((match_list1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data
        ._M_finish != piVar1) {
      *piVar1 = 0;
      piVar1 = (match_list2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((match_list2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_finish != piVar1) {
        *piVar1 = 0;
        return true;
      }
    }
    std::__throw_out_of_range_fmt
              ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",0,0);
  }
  pMVar2->reporter_ = (Reporter *)0x0;
  num_diffs_reporter.super_Reporter._vptr_Reporter = (_func_int **)&PTR__Reporter_004bdbe8;
  num_diffs_reporter.num_diffs_ = 0;
  num_diffs_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  num_diffs_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  num_diffs_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  if (bVar3) {
    local_d8.count1_ = 0x7fffffff;
    std::vector<int,_std::allocator<int>_>::_M_fill_assign(&num_diffs_list1,__n,&local_d8.count1_);
  }
  local_150 = pRVar14;
  if (pMVar2->scope_ == PARTIAL) {
    local_58 = (_func_void *)0x0;
    uStack_50 = 0;
    local_48 = (code *)0x0;
    uStack_40 = 0;
    local_d8.match_callback_.super__Function_base._M_functor._M_unused._M_object =
         operator_new(0x38);
    *(MessageDifferencer **)local_d8.match_callback_.super__Function_base._M_functor._M_unused._0_8_
         = pMVar2;
    *(FieldDescriptor ***)
     ((long)local_d8.match_callback_.super__Function_base._M_functor._M_unused._0_8_ + 8) =
         &repeated_field_local;
    *(MapKeyComparator ***)
     ((long)local_d8.match_callback_.super__Function_base._M_functor._M_unused._0_8_ + 0x10) =
         &key_comparator_local;
    *(Message **)
     ((long)local_d8.match_callback_.super__Function_base._M_functor._M_unused._0_8_ + 0x18) =
         local_120;
    *(Message **)
     ((long)local_d8.match_callback_.super__Function_base._M_functor._M_unused._0_8_ + 0x20) =
         local_118;
    *(int **)((long)local_d8.match_callback_.super__Function_base._M_functor._M_unused._0_8_ + 0x28)
         = &unpacked_any_local;
    *(vector<google::protobuf::util::MessageDifferencer::SpecificField,_std::allocator<google::protobuf::util::MessageDifferencer::SpecificField>_>
      **)((long)local_d8.match_callback_.super__Function_base._M_functor._M_unused._0_8_ + 0x30) =
         parent_fields;
    local_d8.count2_ = uVar6;
    local_d8.count1_ = uVar5;
    local_d8.match_callback_._M_invoker =
         std::
         _Function_handler<bool_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/util/message_differencer.cc:1958:21)>
         ::_M_invoke;
    local_d8.match_callback_.super__Function_base._M_functor._8_8_ = uStack_50;
    local_d8.match_callback_.super__Function_base._M_manager =
         std::
         _Function_handler<bool_(int,_int),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/pybind[P]pybind11_protobuf/build_O3/_deps/protobuf-src/src/google/protobuf/util/message_differencer.cc:1958:21)>
         ::_M_manager;
    local_48 = (code *)0x0;
    uStack_40 = 0;
    local_d8.cached_match_results_.
    super_raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<int,_int>,_bool>,_absl::lts_20240722::hash_internal::Hash<std::pair<int,_int>_>,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_bool>_>_>
    .
    super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<int,_int>,_bool>,_absl::lts_20240722::hash_internal::Hash<std::pair<int,_int>_>,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_bool>_>_>
    .settings_.
    super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::hash_internal::Hash<std::pair<int,_int>_>,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_bool>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.capacity_
         = 1;
    local_d8.cached_match_results_.
    super_raw_hash_map<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<int,_int>,_bool>,_absl::lts_20240722::hash_internal::Hash<std::pair<int,_int>_>,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_bool>_>_>
    .
    super_raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<int,_int>,_bool>,_absl::lts_20240722::hash_internal::Hash<std::pair<int,_int>_>,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_bool>_>_>
    .settings_.
    super_CompressedTupleImpl<absl::lts_20240722::container_internal::CompressedTuple<absl::lts_20240722::container_internal::CommonFields,_absl::lts_20240722::hash_internal::Hash<std::pair<int,_int>_>,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_bool>_>_>,_std::integer_sequence<unsigned_long,_0UL,_1UL,_2UL,_3UL>,_true>
    .super_Storage<absl::lts_20240722::container_internal::CommonFields,_0UL,_false>.value.size_ = 0
    ;
    local_d8.match_list1_ = match_list1;
    local_d8.match_list2_ = match_list2;
    local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p._0_4_ = 0xffffffff;
    local_58 = (_func_void *)
               local_d8.match_callback_.super__Function_base._M_functor._M_unused._0_8_;
    std::vector<int,_std::allocator<int>_>::_M_fill_assign
              (match_list1,__n,(value_type_conflict3 *)&local_80);
    local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p =
         (_Bit_type *)
         CONCAT44(local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                  super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p._4_4_,0xffffffff);
    std::vector<int,_std::allocator<int>_>::_M_fill_assign
              (local_d8.match_list2_,local_138,(value_type_conflict3 *)&local_80);
    if (local_48 != (code *)0x0) {
      (*local_48)(&local_58,&local_58,3);
    }
    if (local_d8.count1_ < 1) {
      uVar5 = 0;
    }
    else {
      iVar8 = 0;
      uVar5 = 0;
      do {
        local_159 = false;
        std::vector<bool,_std::allocator<bool>_>::vector
                  (&local_80,(long)local_d8.count1_,&local_159,&local_139);
        bVar3 = anon_unknown_5::MaximumMatcher::FindArgumentPathDFS(&local_d8,iVar8,&local_80);
        bVar15 = local_150 == (Reporter *)0x0;
        if ((vector<int,_std::allocator<int>_> *)
            local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
            _M_start.super__Bit_iterator_base._M_p != (vector<int,_std::allocator<int>_> *)0x0) {
          operator_delete(local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                          super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p,
                          (long)local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_end_of_storage -
                          (long)local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.
                                super__Bvector_impl_data._M_start.super__Bit_iterator_base._M_p);
        }
        if (bVar15 && !bVar3) {
          uVar5 = 0;
          goto LAB_00315e3c;
        }
        uVar5 = uVar5 + bVar3;
        iVar8 = iVar8 + 1;
      } while (iVar8 < local_d8.count1_);
    }
    if (0 < local_d8.count2_) {
      piVar1 = ((local_d8.match_list2_)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start;
      lVar11 = 0;
      do {
        lVar12 = (long)piVar1[lVar11];
        if (lVar12 != -1) {
          ((local_d8.match_list1_)->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
          super__Vector_impl_data._M_start[lVar12] = (int)lVar11;
        }
        lVar11 = lVar11 + 1;
      } while (lVar11 < local_d8.count2_);
    }
LAB_00315e3c:
    pRVar14 = local_150;
    bVar3 = local_150 == (Reporter *)0x0;
    bVar15 = uVar5 == local_158;
    absl::lts_20240722::container_internal::
    raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<int,_int>,_bool>,_absl::lts_20240722::hash_internal::Hash<std::pair<int,_int>_>,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_bool>_>_>
    ::~raw_hash_set((raw_hash_set<absl::lts_20240722::container_internal::FlatHashMapPolicy<std::pair<int,_int>,_bool>,_absl::lts_20240722::hash_internal::Hash<std::pair<int,_int>_>,_std::equal_to<std::pair<int,_int>_>,_std::allocator<std::pair<const_std::pair<int,_int>,_bool>_>_>
                     *)&local_d8.cached_match_results_);
    if (local_d8.match_callback_.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_d8.match_callback_.super__Function_base._M_manager)
                ((_Any_data *)&local_d8.match_callback_,(_Any_data *)&local_d8.match_callback_,
                 __destroy_functor);
    }
    if (bVar3 && !bVar15) {
LAB_00315e82:
      bVar15 = false;
      goto LAB_0031615a;
    }
  }
  else {
    bVar15 = IsTreatedAsSet(pMVar2,repeated_field_local);
    uVar7 = extraout_RDX;
    if (bVar15 || bVar3) {
LAB_00315d40:
      uVar5 = local_158;
      if ((int)uVar6 < (int)local_158) {
        uVar5 = uVar6;
      }
      uVar10 = (ulong)uVar5;
      if (0 < (int)uVar5) {
        local_138 = CONCAT44(local_138._4_4_,uVar5);
        uVar9 = 0;
        do {
          iVar8 = (int)uVar9;
          bVar15 = IsMatch(pMVar2,repeated_field_local,key_comparator_local,local_120,local_118,
                           unpacked_any_local,parent_fields,(Reporter *)0x0,iVar8,iVar8);
          pRVar14 = local_150;
          if (!bVar15) {
            uVar10 = uVar9 & 0xffffffff;
            uVar7 = extraout_RDX_01;
            goto LAB_00315e90;
          }
          piVar1 = (match_list1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          if ((ulong)((long)(match_list1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                            super__Vector_impl_data._M_finish - (long)piVar1 >> 2) <= uVar9) {
LAB_00316196:
            std::__throw_out_of_range_fmt
                      ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                       uVar9);
          }
          piVar1[uVar9] = iVar8;
          piVar1 = (match_list2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start;
          uVar7 = (long)(match_list2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                        super__Vector_impl_data._M_finish - (long)piVar1 >> 2;
          if (uVar7 <= uVar9) goto LAB_00316196;
          piVar1[uVar9] = iVar8;
          uVar9 = uVar9 + 1;
        } while (uVar10 != uVar9);
        uVar10 = local_138 & 0xffffffff;
      }
    }
    else {
      bVar15 = IsTreatedAsSmartList(pMVar2,repeated_field_local);
      uVar10 = 0;
      uVar7 = extraout_RDX_00;
      if (bVar15) goto LAB_00315d40;
    }
LAB_00315e90:
    bVar15 = true;
    iVar8 = (int)uVar10;
    if (iVar8 < (int)local_158) {
      uVar9 = CONCAT71((int7)(uVar7 >> 8),1);
      local_138 = CONCAT44(local_138._4_4_,iVar8);
      uVar7 = (long)iVar8;
      do {
        if ((int)uVar10 < (int)uVar6) {
          local_130 = (MapKeyComparator *)CONCAT44(local_130._4_4_,(int)uVar9);
          uVar9 = 0xffffffff;
          uVar10 = (long)iVar8;
          do {
            piVar1 = (match_list2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            if ((ulong)((long)(match_list2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_finish - (long)piVar1 >> 2) <= uVar10) {
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,uVar10);
            }
            lVar11 = (long)piVar1[uVar10];
            index1 = (int)uVar7;
            if (lVar11 == -1) {
              if (bVar3) goto LAB_00315f20;
              bVar15 = IsMatch(local_128,repeated_field_local,key_comparator_local,local_120,
                               local_118,unpacked_any_local,parent_fields,(Reporter *)0x0,index1,
                               (int)uVar10);
              if (bVar15) goto LAB_00316086;
            }
            else if (((bVar3) &&
                     (num_diffs_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start[uVar7] != 0)) &&
                    (num_diffs_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_start[lVar11] != 0)) {
LAB_00315f20:
              num_diffs_reporter.num_diffs_ = 0;
              bVar15 = IsMatch(local_128,repeated_field_local,key_comparator_local,local_120,
                               local_118,unpacked_any_local,parent_fields,
                               &num_diffs_reporter.super_Reporter,index1,(int)uVar10);
              if (bVar15) {
                num_diffs_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[uVar7] = 0;
                goto LAB_00316038;
              }
              if ((*(int *)(FieldDescriptor::kTypeToCppTypeMap +
                           (ulong)repeated_field_local->type_ * 4) == 10) &&
                 (num_diffs_reporter.num_diffs_ <
                  num_diffs_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar7])) {
                piVar1 = (match_list2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start;
                if ((ulong)((long)(match_list2->super__Vector_base<int,_std::allocator<int>_>).
                                  _M_impl.super__Vector_impl_data._M_finish - (long)piVar1 >> 2) <=
                    uVar10) {
                  std::__throw_out_of_range_fmt
                            ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                             ,uVar10);
                }
                lVar11 = (long)piVar1[uVar10];
                if ((lVar11 == -1) ||
                   (num_diffs_reporter.num_diffs_ <
                    num_diffs_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start[lVar11])) {
                  num_diffs_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar7] = num_diffs_reporter.num_diffs_;
                  uVar9 = uVar10 & 0xffffffff;
                  if (num_diffs_reporter.num_diffs_ == 0) goto LAB_00316038;
                }
              }
            }
            iVar13 = (int)uVar9;
            uVar10 = uVar10 + 1;
          } while (uVar6 != (uint)uVar10);
          if (iVar13 == -1) {
            bVar4 = 0;
          }
          else {
            bVar4 = 1;
            uVar10 = uVar9;
            if (bVar3) {
LAB_00316038:
              iVar13 = (int)uVar10;
              uVar9 = (ulong)iVar13;
              piVar1 = (match_list2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                       super__Vector_impl_data._M_start;
              if ((ulong)((long)(match_list2->super__Vector_base<int,_std::allocator<int>_>)._M_impl
                                .super__Vector_impl_data._M_finish - (long)piVar1 >> 2) <= uVar9)
              goto LAB_003161bb;
              uVar9 = (ulong)piVar1[uVar9];
              if (uVar9 == 0xffffffffffffffff) {
LAB_00316086:
                iVar13 = (int)uVar10;
                bVar4 = 1;
              }
              else {
                piVar1 = (match_list1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                         super__Vector_impl_data._M_start;
                if ((ulong)((long)(match_list1->super__Vector_base<int,_std::allocator<int>_>).
                                  _M_impl.super__Vector_impl_data._M_finish - (long)piVar1 >> 2) <=
                    uVar9) goto LAB_003161bb;
                piVar1[uVar9] = -1;
                bVar4 = 0;
              }
            }
            piVar1 = (match_list1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            uVar9 = uVar7;
            if ((ulong)((long)(match_list1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_finish - (long)piVar1 >> 2) <= uVar7) {
LAB_003161bb:
              std::__throw_out_of_range_fmt
                        ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)"
                         ,uVar9);
            }
            piVar1[uVar7] = iVar13;
            uVar9 = (ulong)iVar13;
            piVar1 = (match_list2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            if ((ulong)((long)(match_list2->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                              super__Vector_impl_data._M_finish - (long)piVar1 >> 2) <= uVar9)
            goto LAB_003161bb;
            piVar1[uVar9] = index1;
          }
          uVar9 = (ulong)local_130 & 0xffffffff;
          uVar10 = local_138 & 0xffffffff;
          pRVar14 = local_150;
        }
        else {
          bVar4 = 0;
        }
        if ((pRVar14 != (Reporter *)0x0 | bVar4) != 1) goto LAB_00315e82;
        bVar15 = (bool)((byte)uVar9 & bVar4);
        uVar9 = CONCAT71((int7)(uVar9 >> 8),bVar15);
        uVar7 = uVar7 + 1;
      } while (local_158 != (uint)uVar7);
    }
  }
  pMVar2 = local_128;
  bVar3 = IsTreatedAsSmartList(local_128,repeated_field_local);
  if (bVar3) {
    local_d8._0_8_ = match_list1;
    local_80.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)match_list2;
    if ((pMVar2->match_indices_for_smart_list_callback_).super__Function_base._M_manager ==
        (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    (*(pMVar2->match_indices_for_smart_list_callback_)._M_invoker)
              ((_Any_data *)&pMVar2->match_indices_for_smart_list_callback_,
               (vector<int,_std::allocator<int>_> **)&local_d8,
               (vector<int,_std::allocator<int>_> **)&local_80);
  }
  pMVar2->reporter_ = pRVar14;
LAB_0031615a:
  if (num_diffs_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (pointer)0x0) {
    operator_delete(num_diffs_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)num_diffs_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)num_diffs_list1.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  return bVar15;
}

Assistant:

bool MessageDifferencer::MatchRepeatedFieldIndices(
    const Message& message1, const Message& message2, int unpacked_any,
    const FieldDescriptor* repeated_field,
    const MapKeyComparator* key_comparator,
    const std::vector<SpecificField>& parent_fields,
    std::vector<int>* match_list1, std::vector<int>* match_list2) {
  const int count1 =
      message1.GetReflection()->FieldSize(message1, repeated_field);
  const int count2 =
      message2.GetReflection()->FieldSize(message2, repeated_field);
  const bool is_treated_as_smart_set = IsTreatedAsSmartSet(repeated_field);

  match_list1->assign(count1, -1);
  match_list2->assign(count2, -1);

  // In the special case where both repeated fields have exactly one element,
  // return without calling the comparator.  This optimization prevents the
  // pathological case of deeply nested repeated fields of size 1 from taking
  // exponential-time to compare.
  //
  // In the case where reporter_ is set, we need to do the compare here to
  // properly distinguish a modify from an add+delete.  The code below will not
  // pass the reporter along in recursive calls to nested repeated fields, so
  // the inner call will have the opportunity to perform this optimization and
  // avoid exponential-time behavior.
  //
  // In the case where key_comparator is set, we need to do the compare here to
  // fulfill the interface contract that keys will be compared even if the user
  // asked to ignore that field.  The code will only compare the key fields
  // which (hopefully) do not contain further repeated fields.
  if (count1 == 1 && count2 == 1 && reporter_ == nullptr &&
      key_comparator == nullptr) {
    match_list1->at(0) = 0;
    match_list2->at(0) = 0;
    return true;
  }

  // Ensure that we don't report differences during the matching process. Since
  // field comparators could potentially use this message differencer object to
  // perform further comparisons, turn off reporting here and re-enable it
  // before returning.
  Reporter* reporter = reporter_;
  reporter_ = NULL;
  NumDiffsReporter num_diffs_reporter;
  std::vector<int32_t> num_diffs_list1;
  if (is_treated_as_smart_set) {
    num_diffs_list1.assign(count1, std::numeric_limits<int32_t>::max());
  }

  bool success = true;
  // Find potential match if this is a special repeated field.
  if (scope_ == PARTIAL) {
    // When partial matching is enabled, Compare(a, b) && Compare(a, c)
    // doesn't necessarily imply Compare(b, c). Therefore a naive greedy
    // algorithm will fail to find a maximum matching.
    // Here we use the augmenting path algorithm.
    auto callback = [&](int i1, int i2) {
      return IsMatch(repeated_field, key_comparator, &message1, &message2,
                     unpacked_any, parent_fields, nullptr, i1, i2);
    };
    MaximumMatcher matcher(count1, count2, std::move(callback), match_list1,
                           match_list2);
    // If diff info is not needed, we should end the matching process as
    // soon as possible if not all items can be matched.
    bool early_return = (reporter == nullptr);
    int match_count = matcher.FindMaximumMatch(early_return);
    if (match_count != count1 && early_return) return false;
    success = success && (match_count == count1);
  } else {
    int start_offset = 0;
    // If the two repeated fields are treated as sets, optimize for the case
    // where both start with same items stored in the same order.
    if (IsTreatedAsSet(repeated_field) || is_treated_as_smart_set ||
        IsTreatedAsSmartList(repeated_field)) {
      start_offset = std::min(count1, count2);
      for (int i = 0; i < count1 && i < count2; i++) {
        if (IsMatch(repeated_field, key_comparator, &message1, &message2,
                    unpacked_any, parent_fields, nullptr, i, i)) {
          match_list1->at(i) = i;
          match_list2->at(i) = i;
        } else {
          start_offset = i;
          break;
        }
      }
    }
    for (int i = start_offset; i < count1; ++i) {
      // Indicates any matched elements for this repeated field.
      bool match = false;
      int matched_j = -1;

      for (int j = start_offset; j < count2; j++) {
        if (match_list2->at(j) != -1) {
          if (!is_treated_as_smart_set || num_diffs_list1[i] == 0 ||
              num_diffs_list1[match_list2->at(j)] == 0) {
            continue;
          }
        }

        if (is_treated_as_smart_set) {
          num_diffs_reporter.Reset();
          match =
              IsMatch(repeated_field, key_comparator, &message1, &message2,
                      unpacked_any, parent_fields, &num_diffs_reporter, i, j);
        } else {
          match = IsMatch(repeated_field, key_comparator, &message1, &message2,
                          unpacked_any, parent_fields, nullptr, i, j);
        }

        if (is_treated_as_smart_set) {
          if (match) {
            num_diffs_list1[i] = 0;
          } else if (repeated_field->cpp_type() ==
                     FieldDescriptor::CPPTYPE_MESSAGE) {
            // Replace with the one with fewer diffs.
            const int32_t num_diffs = num_diffs_reporter.GetNumDiffs();
            if (num_diffs < num_diffs_list1[i]) {
              // If j has been already matched to some element, ensure the
              // current num_diffs is smaller.
              if (match_list2->at(j) == -1 ||
                  num_diffs < num_diffs_list1[match_list2->at(j)]) {
                num_diffs_list1[i] = num_diffs;
                match = true;
              }
            }
          }
        }

        if (match) {
          matched_j = j;
          if (!is_treated_as_smart_set || num_diffs_list1[i] == 0) {
            break;
          }
        }
      }

      match = (matched_j != -1);
      if (match) {
        if (is_treated_as_smart_set && match_list2->at(matched_j) != -1) {
          // This is to revert the previously matched index in list2.
          match_list1->at(match_list2->at(matched_j)) = -1;
          match = false;
        }
        match_list1->at(i) = matched_j;
        match_list2->at(matched_j) = i;
      }
      if (!match && reporter == nullptr) return false;
      success = success && match;
    }
  }

  if (IsTreatedAsSmartList(repeated_field)) {
    match_indices_for_smart_list_callback_(match_list1, match_list2);
  }

  reporter_ = reporter;

  return success;
}